

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

bool __thiscall ViconDataStreamSDK::Core::VClient::IsEyeTrackerDevice(VClient *this,uint i_DeviceID)

{
  pointer pVVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  scoped_lock Lock;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  pVVar1 = (this->m_LatestFrame).m_EyeTrackers.
           super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->m_LatestFrame).m_EyeTrackers.
                 super__Vector_base<ViconCGStream::VEyeTrackerInfo,_std::allocator<ViconCGStream::VEyeTrackerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x48;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar3 <= uVar4) break;
    uVar2 = (ulong)((int)uVar4 + 1);
  } while (pVVar1[uVar4].m_DeviceID != i_DeviceID);
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return uVar4 < uVar3;
}

Assistant:

bool VClient::IsEyeTrackerDevice(unsigned int i_DeviceID) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  for( unsigned int i = 0; i < m_LatestFrame.m_EyeTrackers.size(); i++ )
  {
    if( m_LatestFrame.m_EyeTrackers[ i ].m_DeviceID == i_DeviceID )
    {
      return true;
    }
  }

  return false;
}